

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O2

void biftim(bifcxdef *ctx,int argc)

{
  int iVar1;
  runsdef *prVar2;
  runcxdef *ctx_00;
  time_t tVar3;
  int32_t tmp_3;
  tm *ptVar4;
  long num;
  time_t timer;
  runsdef val;
  uchar ret [80];
  
  if (argc == 1) {
    prVar2 = ctx->bifcxrun->runcxsp;
    ctx->bifcxrun->runcxsp = prVar2 + -1;
    ctx_00 = ctx->bifcxrun;
    if (prVar2[-1].runstyp != '\x01') {
      ctx_00->runcxerr->errcxptr->erraac = 0;
      runsign(ctx->bifcxrun,0x3eb);
    }
    iVar1 = *(int *)&ctx_00->runcxsp->runsv;
    if (iVar1 == 2) {
      num = os_get_sys_clock_ms();
      runpnum(ctx_00,num);
      return;
    }
    if (iVar1 != 1) {
      ctx_00->runcxerr->errcxptr->erraav[0].errastr = "gettime";
      ctx->bifcxrun->runcxerr->errcxptr->erraac = 1;
      runsign(ctx->bifcxrun,0x400);
    }
  }
  timer = time((time_t *)0x0);
  ptVar4 = localtime(&timer);
  tVar3 = timer;
  ret._8_4_ = ptVar4->tm_mon + 1;
  ret._3_4_ = ptVar4->tm_year + 0x76c;
  ret._18_4_ = ptVar4->tm_wday + 1;
  ret._23_4_ = ptVar4->tm_yday + 1;
  ptVar4->tm_mon = ret._8_4_;
  ptVar4->tm_year = ret._3_4_;
  ptVar4->tm_wday = ret._18_4_;
  ptVar4->tm_yday = ret._23_4_;
  val.runsv.runsvstr = ret;
  ret[0] = '/';
  ret[1] = '\0';
  ret[2] = '\x01';
  ret[7] = '\x01';
  ret._13_4_ = ptVar4->tm_mday;
  ret[0xc] = '\x01';
  ret[0x11] = '\x01';
  ret[0x16] = '\x01';
  ret._28_4_ = ptVar4->tm_hour;
  ret[0x1b] = '\x01';
  ret._33_4_ = ptVar4->tm_min;
  ret[0x20] = '\x01';
  ret._38_4_ = ptVar4->tm_sec;
  ret[0x25] = '\x01';
  ret[0x2a] = '\x01';
  ret[0x2b] = (uchar)timer;
  ret[0x2c] = timer._1_1_;
  ret[0x2d] = timer._2_1_;
  ret[0x2e] = timer._3_1_;
  val.runstyp = '\a';
  timer = tVar3;
  runpush(ctx->bifcxrun,7,&val);
  return;
}

Assistant:

void biftim(bifcxdef *ctx, int argc)
{
    time_t     timer;
    struct tm *tblock;
    uchar      ret[80];
    uchar     *p;
    runsdef    val;
    int        typ;

    if (argc == 1)
    {
        /* get the time type */
        typ = (int)runpopnum(ctx->bifcxrun);
    }
    else
    {
        /* make sure no arguments are specified */
        bifcntargs(ctx, 0, argc);

        /* use the default time type */
        typ = 1;
    }

    switch(typ)
    {
    case 1:
        /* 
         *   default information format - list format with current system
         *   time and date 
         */

        /* make sure the time zone is set up properly */
        os_tzset();
        
        /* get the local time information */
        timer = time(NULL);
        tblock = localtime(&timer);
        
        /* adjust values for return format */
        tblock->tm_year += 1900;
        tblock->tm_mon++;
        tblock->tm_wday++;
        tblock->tm_yday++;
        
        /* build return list value */
        oswp2(ret, 47);
        p = ret + 2;
        p = bifputnum(p, tblock->tm_year);
        p = bifputnum(p, tblock->tm_mon);
        p = bifputnum(p, tblock->tm_mday);
        p = bifputnum(p, tblock->tm_wday);
        p = bifputnum(p, tblock->tm_yday);
        p = bifputnum(p, tblock->tm_hour);
        p = bifputnum(p, tblock->tm_min);
        p = bifputnum(p, tblock->tm_sec);
        *p++ = DAT_NUMBER;
        oswp4s(p, (long)timer);
        
        val.runstyp = DAT_LIST;
        val.runsv.runsvstr = ret;
        runpush(ctx->bifcxrun, DAT_LIST, &val);
        break;

    case 2:
        /*
         *   High-precision system timer value - returns the system time
         *   in milliseconds, relative to an arbitrary zero point 
         */
        runpnum(ctx->bifcxrun, os_get_sys_clock_ms());
        break;

    default:
        /* other types are invalid */
        runsig1(ctx->bifcxrun, ERR_INVVBIF, ERRTSTR, "gettime");
        break;
    }
}